

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastPower(Gia_Man_t *pNew,int *pNum,int nNum,int *pExp,int nExp,Vec_Int_t *vTemp,
                   Vec_Int_t *vRes)

{
  int *pArg0;
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Int_t *vRes_00;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int *local_70;
  
  uVar5 = (ulong)(uint)nNum;
  p = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nNum * 2 - 1U) {
    iVar1 = nNum * 2;
  }
  p->nSize = 0;
  p->nCap = iVar1;
  if (iVar1 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar1 * 4);
  }
  p->pArray = piVar2;
  vRes_00 = (Vec_Int_t *)malloc(0x10);
  vRes_00->nSize = 0;
  vRes_00->nCap = iVar1;
  if (iVar1 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar1 << 2);
  }
  vRes_00->pArray = piVar2;
  pArg0 = vRes->pArray;
  if (vRes->nCap < nNum) {
    if (pArg0 == (int *)0x0) {
      piVar3 = (int *)malloc((long)nNum << 2);
    }
    else {
      piVar3 = (int *)realloc(pArg0,(long)nNum << 2);
    }
    vRes->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vRes->nCap = nNum;
  }
  if (nNum < 1) {
    vRes->nSize = nNum;
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar3 = vRes->pArray;
  memset(piVar3,0,uVar5 * 4);
  vRes->nSize = nNum;
  *piVar3 = 1;
  if (0 < nExp) {
    uVar6 = 0;
    local_70 = (int *)0x0;
    do {
      if (uVar6 == 0) {
        p->nSize = 0;
        uVar4 = 0;
        do {
          Vec_IntPush(p,pNum[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      else {
        Wlc_BlastMultiplier2(pNew,local_70,local_70,nNum,vTemp,vRes_00);
        p->nSize = 0;
        uVar4 = 0;
        do {
          Vec_IntPush(p,piVar2[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      local_70 = p->pArray;
      Wlc_BlastMultiplier2(pNew,pArg0,local_70,nNum,vTemp,vRes_00);
      uVar4 = 0;
      do {
        iVar1 = Gia_ManHashMux(pNew,pExp[uVar6],piVar2[uVar4],pArg0[uVar4]);
        pArg0[uVar4] = iVar1;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nExp);
  }
  if (vRes_00->pArray != (int *)0x0) {
    free(vRes_00->pArray);
    vRes_00->pArray = (int *)0x0;
  }
  free(vRes_00);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Wlc_BlastPower( Gia_Man_t * pNew, int * pNum, int nNum, int * pExp, int nExp, Vec_Int_t * vTemp, Vec_Int_t * vRes )
{
    Vec_Int_t * vDegrees = Vec_IntAlloc( 2*nNum );
    Vec_Int_t * vResTemp = Vec_IntAlloc( 2*nNum );
    int i, * pDegrees = NULL, * pRes = Vec_IntArray(vRes);
    int k, * pResTemp = Vec_IntArray(vResTemp);
    Vec_IntFill( vRes, nNum, 0 );
    Vec_IntWriteEntry( vRes, 0, 1 );
    for ( i = 0; i < nExp; i++ )
    {
        if ( i == 0 )
            pDegrees = Wlc_VecCopy( vDegrees, pNum, nNum );
        else
        {
            Wlc_BlastMultiplier2( pNew, pDegrees, pDegrees, nNum, vTemp, vResTemp );
            pDegrees = Wlc_VecCopy( vDegrees, pResTemp, nNum );
        }
        Wlc_BlastMultiplier2( pNew, pRes, pDegrees, nNum, vTemp, vResTemp );
        for ( k = 0; k < nNum; k++ )
            pRes[k] = Gia_ManHashMux( pNew, pExp[i], pResTemp[k], pRes[k] );
    }
    Vec_IntFree( vResTemp );
    Vec_IntFree( vDegrees );
}